

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.hpp
# Opt level: O0

type * __thiscall msgpack::v1::object::as<std::tuple<int,std::__cxx11::string>>(object *this)

{
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  object *in_RDI;
  tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *v;
  object *this_00;
  
  this_00 = in_RDI;
  std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::tuple<true,_true>((tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x29ccdf);
  convert<std::tuple<int,std::__cxx11::string>>(this_00,in_RSI);
  return (type *)in_RDI;
}

Assistant:

inline typename std::enable_if<!msgpack::has_as<T>::value, T>::type object::as() const {
    T v;
    convert(v);
    return v;
}